

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeSet::_generatePattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  int iVar1;
  int iVar2;
  UnicodeString *pUVar3;
  ulong uVar4;
  int32_t i;
  int iVar5;
  ulong uVar6;
  
  UnicodeString::append(result,L'[');
  uVar6 = (long)this->len / 2;
  uVar4 = uVar6 & 0xffffffff;
  iVar5 = (int)uVar6;
  if (((this->len < 4) || (*this->list != 0)) ||
     (this->list[(ulong)(uint)(iVar5 * 2) - 1] != 0x110000)) {
    uVar6 = 0;
    if (iVar5 < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = this->list[uVar6 * 2];
      iVar2 = this->list[uVar6 * 2 + 1];
      iVar5 = iVar2 + -1;
      _appendToPat(result,iVar1,escapeUnprintable);
      if (iVar1 != iVar5) {
        if (iVar1 != iVar2 + -2) {
          UnicodeString::append(result,L'-');
        }
        _appendToPat(result,iVar5,escapeUnprintable);
      }
    }
  }
  else {
    UnicodeString::append(result,L'^');
    for (uVar6 = 1; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = this->list[uVar6 * 2 + -1];
      iVar2 = this->list[uVar6 * 2];
      iVar5 = iVar2 + -1;
      _appendToPat(result,iVar1,escapeUnprintable);
      if (iVar1 != iVar5) {
        if (iVar1 != iVar2 + -2) {
          UnicodeString::append(result,L'-');
        }
        _appendToPat(result,iVar5,escapeUnprintable);
      }
    }
  }
  for (iVar5 = 0; iVar5 < this->strings->count; iVar5 = iVar5 + 1) {
    UnicodeString::append(result,L'{');
    pUVar3 = (UnicodeString *)UVector::elementAt(this->strings,iVar5);
    _appendToPat(result,pUVar3,escapeUnprintable);
    UnicodeString::append(result,L'}');
  }
  pUVar3 = UnicodeString::append(result,L']');
  return pUVar3;
}

Assistant:

UnicodeString& UnicodeSet::_generatePattern(UnicodeString& result,
                                            UBool escapeUnprintable) const
{
    result.append(SET_OPEN);

//  // Check against the predefined categories.  We implicitly build
//  // up ALL category sets the first time toPattern() is called.
//  for (int8_t cat=0; cat<Unicode::GENERAL_TYPES_COUNT; ++cat) {
//      if (*this == getCategorySet(cat)) {
//          result.append(COLON);
//          result.append(CATEGORY_NAMES, cat*2, 2);
//          return result.append(CATEGORY_CLOSE);
//      }
//  }

    int32_t count = getRangeCount();

    // If the set contains at least 2 intervals and includes both
    // MIN_VALUE and MAX_VALUE, then the inverse representation will
    // be more economical.
    if (count > 1 &&
        getRangeStart(0) == MIN_VALUE &&
        getRangeEnd(count-1) == MAX_VALUE) {

        // Emit the inverse
        result.append(COMPLEMENT);

        for (int32_t i = 1; i < count; ++i) {
            UChar32 start = getRangeEnd(i-1)+1;
            UChar32 end = getRangeStart(i)-1;
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    // Default; emit the ranges as pairs
    else {
        for (int32_t i = 0; i < count; ++i) {
            UChar32 start = getRangeStart(i);
            UChar32 end = getRangeEnd(i);
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    for (int32_t i = 0; i<strings->size(); ++i) {
        result.append(OPEN_BRACE);
        _appendToPat(result,
                     *(const UnicodeString*) strings->elementAt(i),
                     escapeUnprintable);
        result.append(CLOSE_BRACE);
    }
    return result.append(SET_CLOSE);
}